

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_or_vec_mips64el
               (TCGContext_conflict6 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b)

{
  TCGv_vec in_R9;
  
  vec_gen_op3(tcg_ctx,INDEX_op_or_vec,(uint)r,a,b,in_R9);
  return;
}

Assistant:

void tcg_gen_or_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    vec_gen_op3(tcg_ctx, INDEX_op_or_vec, 0, r, a, b);
}